

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::TreeEnsembleRegressor::Clear(TreeEnsembleRegressor *this)

{
  ulong uVar1;
  TreeEnsembleParameters *this_00;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_00 = this->treeensemble_, this_00 != (TreeEnsembleParameters *)0x0)) {
    TreeEnsembleParameters::~TreeEnsembleParameters(this_00);
    operator_delete(this_00,0x48);
  }
  this->treeensemble_ = (TreeEnsembleParameters *)0x0;
  this->postevaluationtransform_ = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TreeEnsembleRegressor::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.TreeEnsembleRegressor)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  if (GetArenaForAllocation() == nullptr && treeensemble_ != nullptr) {
    delete treeensemble_;
  }
  treeensemble_ = nullptr;
  postevaluationtransform_ = 0;
  _internal_metadata_.Clear<std::string>();
}